

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_NodeVecDup(Fraig_NodeVec_t *pVec)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t **local_20;
  Fraig_NodeVec_t *p;
  Fraig_NodeVec_t *pVec_local;
  
  pFVar1 = (Fraig_NodeVec_t *)malloc(0x10);
  pFVar1->nSize = pVec->nSize;
  pFVar1->nCap = pVec->nCap;
  if (pFVar1->nCap == 0) {
    local_20 = (Fraig_Node_t **)0x0;
  }
  else {
    local_20 = (Fraig_Node_t **)malloc((long)pFVar1->nCap << 3);
  }
  pFVar1->pArray = local_20;
  memcpy(pFVar1->pArray,pVec->pArray,(long)pVec->nSize << 3);
  return pFVar1;
}

Assistant:

Fraig_NodeVec_t * Fraig_NodeVecDup( Fraig_NodeVec_t * pVec )
{
    Fraig_NodeVec_t * p;
    p = ABC_ALLOC( Fraig_NodeVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( Fraig_Node_t *, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(Fraig_Node_t *) * pVec->nSize );
    return p;
}